

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264.c
# Opt level: O2

int h264_hrd_parameters(bitstream *str,h264_hrd_parameters *hrd)

{
  int iVar1;
  uint uVar2;
  uint32_t *val;
  ulong uVar3;
  
  iVar1 = vs_ue(str,&hrd->cpb_cnt_minus1);
  uVar2 = 1;
  if (iVar1 == 0) {
    if (hrd->cpb_cnt_minus1 < 0x20) {
      iVar1 = vs_u(str,&hrd->bit_rate_scale,4);
      if ((iVar1 == 0) && (iVar1 = vs_u(str,&hrd->cpb_size_scale,4), iVar1 == 0)) {
        uVar3 = 0xffffffffffffffff;
        uVar2 = 1;
        val = hrd->cbr_flag;
        while (uVar3 = uVar3 + 1, uVar3 <= hrd->cpb_cnt_minus1) {
          iVar1 = vs_ue(str,val + -0x40);
          if (iVar1 != 0) {
            return 1;
          }
          iVar1 = vs_ue(str,val + -0x20);
          if (iVar1 != 0) {
            return 1;
          }
          iVar1 = vs_u(str,val,1);
          val = val + 1;
          if (iVar1 != 0) {
            return 1;
          }
        }
        iVar1 = vs_u(str,&hrd->initial_cpb_removal_delay_length_minus1,5);
        if (((iVar1 == 0) && (iVar1 = vs_u(str,&hrd->cpb_removal_delay_length_minus1,5), iVar1 == 0)
            ) && (iVar1 = vs_u(str,&hrd->dpb_output_delay_length_minus1,5), iVar1 == 0)) {
          iVar1 = vs_u(str,&hrd->time_offset_length,5);
          uVar2 = (uint)(iVar1 != 0);
        }
      }
    }
    else {
      fwrite("cpb_cnt_minus1 out of range\n",0x1c,1,_stderr);
    }
  }
  return uVar2;
}

Assistant:

int h264_hrd_parameters(struct bitstream *str, struct h264_hrd_parameters *hrd) {
	if (vs_ue(str, &hrd->cpb_cnt_minus1)) return 1;
	if (hrd->cpb_cnt_minus1 > 31) {
		fprintf(stderr, "cpb_cnt_minus1 out of range\n");
		return 1;
	}
	if (vs_u(str, &hrd->bit_rate_scale, 4)) return 1;
	if (vs_u(str, &hrd->cpb_size_scale, 4)) return 1;
	int i;
	for (i = 0; i <= hrd->cpb_cnt_minus1; i++) {
		if (vs_ue(str, &hrd->bit_rate_value_minus1[i])) return 1;
		if (vs_ue(str, &hrd->cpb_size_value_minus1[i])) return 1;
		if (vs_u(str, &hrd->cbr_flag[i], 1)) return 1;
	}
	if (vs_u(str, &hrd->initial_cpb_removal_delay_length_minus1, 5)) return 1;
	if (vs_u(str, &hrd->cpb_removal_delay_length_minus1, 5)) return 1;
	if (vs_u(str, &hrd->dpb_output_delay_length_minus1, 5)) return 1;
	if (vs_u(str, &hrd->time_offset_length, 5)) return 1;
	return 0;
}